

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

optional<pbrt::Bounds2<float>_> * __thiscall
pbrt::PortalImageInfiniteLight::ImageBounds
          (optional<pbrt::Bounds2<float>_> *__return_storage_ptr__,PortalImageInfiniteLight *this,
          Point3f *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)> aVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Vector3f wRender;
  Vector3f wRender_00;
  optional<pbrt::Point2<float>_> p0;
  optional<pbrt::Point2<float>_> p1;
  undefined1 local_48 [24];
  char local_30;
  undefined1 local_28 [16];
  
  uVar1 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x;
  uVar5 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar15._4_4_ = uVar5;
  auVar15._0_4_ = uVar1;
  auVar15._8_8_ = 0;
  uVar2 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar6 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar21._4_4_ = uVar6;
  auVar21._0_4_ = uVar2;
  auVar21._8_8_ = 0;
  auVar21 = vsubps_avx(auVar15,auVar21);
  auVar16._0_4_ = auVar21._0_4_ * auVar21._0_4_;
  auVar16._4_4_ = auVar21._4_4_ * auVar21._4_4_;
  auVar16._8_4_ = auVar21._8_4_ * auVar21._8_4_;
  auVar16._12_4_ = auVar21._12_4_ * auVar21._12_4_;
  auVar15 = vhaddps_avx(auVar16,auVar16);
  fVar10 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z -
           (p->super_Tuple3<pbrt::Point3,_float>).z;
  fVar11 = auVar15._0_4_ + fVar10 * fVar10;
  if (fVar11 < 0.0) {
    local_28 = auVar21;
    fVar11 = sqrtf(fVar11);
    auVar21 = local_28;
  }
  else {
    auVar15 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
    fVar11 = auVar15._0_4_;
  }
  auVar17._4_4_ = fVar11;
  auVar17._0_4_ = fVar11;
  auVar17._8_4_ = fVar11;
  auVar17._12_4_ = fVar11;
  auVar15 = vdivps_avx(auVar21,auVar17);
  wRender.super_Tuple3<pbrt::Vector3,_float>.z = fVar10 / fVar11;
  wRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar15._0_8_;
  ImageFromRender((PortalImageInfiniteLight *)local_48,wRender,(Float *)this);
  uVar3 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.x;
  uVar7 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.y;
  auVar12._4_4_ = uVar7;
  auVar12._0_4_ = uVar3;
  auVar12._8_8_ = 0;
  uVar4 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar8 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar18._4_4_ = uVar8;
  auVar18._0_4_ = uVar4;
  auVar18._8_8_ = 0;
  auVar21 = vsubps_avx(auVar12,auVar18);
  auVar13._0_4_ = auVar21._0_4_ * auVar21._0_4_;
  auVar13._4_4_ = auVar21._4_4_ * auVar21._4_4_;
  auVar13._8_4_ = auVar21._8_4_ * auVar21._8_4_;
  auVar13._12_4_ = auVar21._12_4_ * auVar21._12_4_;
  auVar15 = vhaddps_avx(auVar13,auVar13);
  fVar10 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.z -
           (p->super_Tuple3<pbrt::Point3,_float>).z;
  fVar11 = auVar15._0_4_ + fVar10 * fVar10;
  if (fVar11 < 0.0) {
    local_28 = auVar21;
    fVar11 = sqrtf(fVar11);
    auVar21 = local_28;
  }
  else {
    auVar15 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
    fVar11 = auVar15._0_4_;
  }
  auVar19._4_4_ = fVar11;
  auVar19._0_4_ = fVar11;
  auVar19._8_4_ = fVar11;
  auVar19._12_4_ = fVar11;
  auVar15 = vdivps_avx(auVar21,auVar19);
  wRender_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar10 / fVar11;
  wRender_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar15._0_8_;
  ImageFromRender((PortalImageInfiniteLight *)(local_48 + 0x10),wRender_00,(Float *)this);
  if ((local_48[8] == '\x01') && (local_30 != '\0')) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_48._16_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_48._0_8_;
    auVar21 = vminps_avx(auVar14,auVar20);
    auVar15 = vmaxps_avx(auVar14,auVar20);
    aVar9 = (aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)>)
            vmovlhps_avx(auVar21,auVar15);
    __return_storage_ptr__->set = true;
    __return_storage_ptr__->optionalValue = aVar9;
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined4 *)&__return_storage_ptr__->set = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Bounds2f> ImageBounds(const Point3f &p) const {
        pstd::optional<Point2f> p0 = ImageFromRender(Normalize(portal[0] - p));
        pstd::optional<Point2f> p1 = ImageFromRender(Normalize(portal[2] - p));
        if (!p0 || !p1)
            return {};
        return Bounds2f(*p0, *p1);
    }